

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O3

void __thiscall mpp_list::mpp_list(mpp_list *this,node_destructor func)

{
  mpp_list_node *pmVar1;
  
  MppMutexCond::MppMutexCond(&this->super_MppMutexCond);
  this->count = 0;
  this->destroy = func;
  pmVar1 = (mpp_list_node *)malloc(0x18);
  this->head = pmVar1;
  if (pmVar1 != (mpp_list_node *)0x0) {
    pmVar1->next = pmVar1;
    pmVar1->prev = pmVar1;
    pmVar1->key = 0;
    pmVar1->size = 0;
    return;
  }
  _mpp_log_l(2,"mpp_list","failed to allocate list header",(char *)0x0);
  return;
}

Assistant:

mpp_list::mpp_list(node_destructor func)
    : destroy(NULL),
      head(NULL),
      count(0)
{
    destroy = func;
    head = (mpp_list_node*)malloc(sizeof(mpp_list_node));
    if (NULL == head) {
        LIST_ERROR("failed to allocate list header");
    } else {
        list_node_init_with_key_and_size(head, 0, 0);
    }
}